

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall notch::core::MakeLayer::logic_error(MakeLayer *this,string *what)

{
  logic_error *this_00;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> m;
  string *what_local;
  MakeLayer *this_local;
  
  ::std::operator+((char *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "cannot create ");
  ::std::operator+(local_38,(char *)local_58);
  ::std::__cxx11::string::~string(local_58);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,(string *)local_38);
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

void logic_error(std::string what) {
        auto m = "cannot create " + what + ": invalid configuration";
        throw std::logic_error(m);
     }